

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,char *ext1,char *ext2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong i;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar9;
  int acc;
  size_t idx;
  char *tmp;
  int borrow;
  int result_neg;
  int pos;
  int hi3;
  int lo3;
  int hi2;
  int lo2;
  int hi1;
  int lo1;
  int max_exp;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *pcVar10;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  uint local_54;
  char *in_stack_ffffffffffffffb0;
  ulong uVar11;
  char *in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_3c;
  int local_38;
  char *local_18;
  char *local_10;
  
  iVar1 = is_zero(in_RDX);
  if (iVar1 == 0) {
    iVar1 = is_zero(in_RSI);
    if (iVar1 == 0) {
      iVar1 = compare_abs(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      local_18 = in_RDX;
      local_10 = in_RSI;
      if (iVar1 < 0) {
        local_18 = in_RSI;
        local_10 = in_RDX;
      }
      local_3c = (uint)(iVar1 < 0);
      iVar1 = get_exp((char *)0x3144d6);
      iVar2 = get_exp((char *)0x3144e7);
      if (iVar1 < iVar2) {
        get_exp((char *)0x3144fa);
      }
      set_exp(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      iVar1 = get_exp((char *)0x31451c);
      iVar2 = get_exp((char *)0x314530);
      sVar8 = get_prec((char *)0x314544);
      iVar2 = iVar2 - (int)sVar8;
      iVar3 = get_exp((char *)0x314560);
      iVar4 = get_exp((char *)0x314574);
      sVar8 = get_prec((char *)0x314588);
      iVar4 = iVar4 - (int)sVar8;
      iVar5 = get_exp((char *)0x3145a4);
      local_38 = get_exp((char *)0x3145b8);
      sVar8 = get_prec((char *)0x3145cc);
      local_38 = local_38 - (int)sVar8;
      local_40 = 0;
      if ((((local_38 + -1 < iVar2) || (iVar1 + -1 < local_38 + -1)) && (iVar4 <= local_38 + -1)) &&
         (local_38 + -1 <= iVar3 + -1)) {
        iVar6 = get_exp((char *)0x314631);
        i = (ulong)((iVar6 - (local_38 + -1)) + -1);
        uVar7 = get_dig(local_18,i);
        if (uVar7 < 6) {
          uVar7 = get_dig(local_18,i);
          if (uVar7 == 5) {
            do {
              uVar11 = i + 1;
              i = uVar11;
              sVar8 = get_prec((char *)0x3146a4);
              if (sVar8 <= uVar11) goto LAB_003146f4;
              uVar7 = get_dig(local_18,i);
            } while (uVar7 == 0);
            local_40 = 1;
          }
        }
        else {
          local_40 = 1;
        }
      }
LAB_003146f4:
      for (; local_38 <= iVar5 + -1; local_38 = local_38 + 1) {
        local_54 = 0;
        if ((iVar2 <= local_38) && (local_38 <= iVar1 + -1)) {
          in_stack_ffffffffffffff80 = local_10;
          iVar6 = get_exp((char *)0x314738);
          local_54 = get_dig(in_stack_ffffffffffffff80,(long)((iVar6 - local_38) + -1));
        }
        if ((iVar4 <= local_38) && (local_38 <= iVar3 + -1)) {
          pcVar10 = local_18;
          iVar6 = get_exp((char *)0x31477e);
          uVar7 = get_dig(pcVar10,(long)((iVar6 - local_38) + -1));
          local_54 = local_54 - uVar7;
        }
        local_54 = local_54 - local_40;
        bVar9 = (int)local_54 < 0;
        if (bVar9) {
          local_54 = local_54 + 10;
        }
        local_40 = (uint)bVar9;
        pcVar10 = in_RDI;
        iVar6 = get_exp((char *)0x3147ea);
        set_dig(pcVar10,(long)((iVar6 - local_38) + -1),local_54);
      }
      set_neg(in_RDI,local_3c);
      normalize(in_stack_ffffffffffffff80);
    }
    else {
      copy_val(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      set_neg(in_RDI,1);
    }
  }
  else {
    copy_val(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  return;
}

Assistant:

void CVmObjBigNum::compute_abs_diff_into(char *new_ext,
                                         const char *ext1, const char *ext2)
{
    int max_exp;
    int lo1, hi1;
    int lo2, hi2;
    int lo3, hi3;
    int pos;
    int result_neg = FALSE;
    int borrow;

    /* if we're subtracting zero or from zero, it's easy */
    if (is_zero(ext2))
    {
        /* 
         *   we're subtracting zero from another value - the result is
         *   simply the first value 
         */
        copy_val(new_ext, ext1, TRUE);
        return;
    }
    else if (is_zero(ext1))
    {
        /* 
         *   We're subtracting a value from zero - we know the value we're
         *   subtracting is non-zero (we already checked for that case
         *   above), and we're only considering the absolute values, so
         *   simply return the negative of the absolute value of the
         *   second operand.  
         */
        copy_val(new_ext, ext2, TRUE);
        set_neg(new_ext, TRUE);
        return;
    }

    /*
     *   Compare the absolute values of the two operands.  If the first
     *   value is larger than the second, subtract them in the given
     *   order.  Otherwise, reverse the order and note that the result is
     *   negative. 
     */
    if (compare_abs(ext1, ext2) < 0)
    {
        const char *tmp;
        
        /* the result will be negative */
        result_neg = TRUE;

        /* swap the order of the subtraction */
        tmp = ext1;
        ext1 = ext2;
        ext2 = tmp;
    }

    /* 
     *   start the new value with the larger of the two exponents - this
     *   will have the desired effect of dropping the least significant
     *   digits if any digits must be dropped 
     */
    max_exp = get_exp(ext1);
    if (get_exp(ext2) > max_exp)
        max_exp = get_exp(ext2);
    set_exp(new_ext, max_exp);

    /* compute the digit positions at the bounds of each of our values */
    hi1 = get_exp(ext1) - 1;
    lo1 = get_exp(ext1) - get_prec(ext1);

    hi2 = get_exp(ext2) - 1;
    lo2 = get_exp(ext2) - get_prec(ext2);

    hi3 = get_exp(new_ext) - 1;
    lo3 = get_exp(new_ext) - get_prec(new_ext);

    /* start off with no borrow */
    borrow = 0;

    /*
     *   Check for borrowing from before the least significant digit
     *   position in common to both numbers 
     */
    if (lo3-1 >= lo1 && lo3-1 <= hi1)
    {
        /* 
         *   In this case, we would be dropping precision from the end of
         *   the top number.  This case should never happen - the only way
         *   it could happen is for the bottom number to extend to the
         *   left of the top number at the most significant end.  This
         *   cannot happen because the bottom number always has small
         *   magnitude by this point (we guarantee this above).  So, we
         *   should never get here.
         */
        assert(FALSE);
    }
    else if (lo3-1 >= lo2 && lo3-1 <= hi2)
    {
        size_t idx;
        
        /*
         *   We're dropping precision from the bottom number, so we want
         *   to borrow into the subtraction if the rest of the number is
         *   greater than 5xxxx.  If it's exactly 5000..., do not borrow,
         *   since the result would end in 5 and we'd round up.
         *   
         *   If the next digit is 6 or greater, we know for a fact we'll
         *   have to borrow.  If the next digit is 4 or less, we know for
         *   a fact we won't have to borrow.  If the next digit is 5,
         *   though, we must look at the rest of the number to see if
         *   there's anything but trailing zeros.  
         */
        idx = (size_t)(get_exp(ext2) - (lo3-1) - 1);
        if (get_dig(ext2, idx) >= 6)
        {
            /* definitely borrow */
            borrow = 1;
        }
        else if (get_dig(ext2, idx) == 5)
        {
            /* borrow only if we have something non-zero following */
            for (++idx ; idx < get_prec(ext2) ; ++idx)
            {
                /* if it's non-zero, we must borrow */
                if (get_dig(ext2, idx) != 0)
                {
                    /* note the borrow */
                    borrow = 1;

                    /* no need to keep scanning */
                    break;
                }
            }
        }
    }

    /* subtract the digits from least to most significant */
    for (pos = lo3 ; pos <= hi3 ; ++pos)
    {
        int acc;

        /* start with zero in the accumulator */
        acc = 0;

        /* start with the top-line value if it's represented here */
        if (pos >= lo1 && pos <= hi1)
            acc = get_dig(ext1, get_exp(ext1) - pos - 1);

        /* subtract the second value digit if it's represented here */
        if (pos >= lo2 && pos <= hi2)
            acc -= get_dig(ext2, get_exp(ext2) - pos - 1);

        /* subtract the borrow */
        acc -= borrow;

        /* check for borrow */
        if (acc < 0)
        {
            /* increase the accumulator */
            acc += 10;

            /* we must borrow from the next digit up */
            borrow = 1;
        }
        else
        {
            /* we're in range - no need to borrow */
            borrow = 0;
        }

        /* set the digit in the result */
        set_dig(new_ext, get_exp(new_ext) - pos - 1, acc);
    }

    /* set the sign of the result as calculated earlier */
    set_neg(new_ext, result_neg);

    /* normalize the number */
    normalize(new_ext);
}